

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnectionTestCase.cpp
# Opt level: O0

void __thiscall
CATCH2_INTERNAL_TEST_0()::TestSession::next(std::__cxx11::string_const&,FIX::
UtcTimeStamp_const__bool_(void *this,string *param_1,UtcTimeStamp *timeStamp,bool queued)

{
  InvalidMessage *this_00;
  allocator<char> local_49;
  string local_48;
  undefined1 local_21;
  UtcTimeStamp *pUStack_20;
  bool queued_local;
  UtcTimeStamp *timeStamp_local;
  string *param_1_local;
  TestSession *this_local;
  
  if ((*(byte *)((long)this + 0x880) & 1) != 0) {
    local_21 = queued;
    pUStack_20 = timeStamp;
    timeStamp_local = (UtcTimeStamp *)param_1;
    param_1_local = (string *)this;
    this_00 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
    FIX::InvalidMessage::InvalidMessage(this_00,&local_48);
    __cxa_throw(this_00,&FIX::InvalidMessage::typeinfo,FIX::InvalidMessage::~InvalidMessage);
  }
  return;
}

Assistant:

virtual void next(const std::string &, const UtcTimeStamp &timeStamp, bool queued = false) {
      if (nextThrowInvalidMsg) {
        throw InvalidMessage();
      }
    }